

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-reduce.cpp
# Opt level: O2

bool __thiscall Reducer::tryToReplaceCurrent(Reducer *this,Expression *with)

{
  PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_> *this_00;
  Expression *expression;
  bool bVar1;
  ulong uVar2;
  ostream *poVar3;
  string local_48;
  
  bVar1 = isOkReplacement(this,with);
  if ((bVar1) &&
     (expression = *(this->
                    super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
                    ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
                    super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.replacep,
     (expression->type).id == (with->type).id)) {
    uVar2 = this->decisionCounter + 1;
    this->decisionCounter = uVar2;
    if (1 < uVar2 % (ulong)(long)this->factor) {
      return false;
    }
    this_00 = &(this->
               super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
               ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>;
    wasm::Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::replaceCurrent
              (&this_00->super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,with)
    ;
    bVar1 = writeAndTestReduction(this);
    if (bVar1) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"|      tryToReplaceCurrent succeeded (in ");
      getLocation_abi_cxx11_(&local_48,this);
      poVar3 = std::operator<<(poVar3,(string *)&local_48);
      std::operator<<(poVar3,")\n");
      std::__cxx11::string::~string((string *)&local_48);
      noteReduction(this,1);
      return true;
    }
    wasm::Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::replaceCurrent
              (&this_00->super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
               expression);
  }
  return false;
}

Assistant:

bool tryToReplaceCurrent(Expression* with) {
    if (!isOkReplacement(with)) {
      return false;
    }
    auto* curr = getCurrent();
    // std::cerr << "try " << curr << " => " << with << '\n';
    if (curr->type != with->type) {
      return false;
    }
    if (!shouldTryToReduce()) {
      return false;
    }
    replaceCurrent(with);
    if (!writeAndTestReduction()) {
      replaceCurrent(curr);
      return false;
    }
    std::cerr << "|      tryToReplaceCurrent succeeded (in " << getLocation()
              << ")\n";
    noteReduction();
    return true;
  }